

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O1

LY_ERR lysp_load_submodules(lysp_ctx *pctx,lysp_module *pmod,ly_set *new_mods)

{
  undefined8 *puVar1;
  ulong *__ptr;
  lyd_node *plVar2;
  long lVar3;
  char *__s1;
  lyd_node **pplVar4;
  lysp_submodule *plVar5;
  lysp_revision *__s2;
  ly_set *plVar6;
  long lVar7;
  bool bVar8;
  int iVar9;
  LY_ERR LVar10;
  lysp_include *plVar11;
  lyd_node_inner **pplVar12;
  long *plVar13;
  undefined8 *puVar14;
  uint uVar15;
  char *pcVar16;
  lysp_include *plVar17;
  bool bVar18;
  LY_ERR unaff_EBP;
  char *pcVar19;
  ly_ctx *plVar20;
  ulong uVar21;
  ulong uVar22;
  ly_ctx *ctx;
  ulong uVar23;
  LY_ERR local_c4;
  lysp_submodule *submod;
  LYS_INFORMAT format;
  undefined8 *local_80;
  char *submodule_data;
  ly_set *local_70;
  ly_in *in;
  _func_void_void_ptr_void_ptr *submodule_data_free;
  lysp_load_module_check_data check_data;
  
  if (pctx == (lysp_ctx *)0x0) {
    ctx = (ly_ctx *)0x0;
  }
  else {
    ctx = (ly_ctx *)
          **(undefined8 **)(pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
  }
  uVar21 = 0;
  local_70 = new_mods;
  do {
    plVar17 = pmod->includes;
    if (plVar17 == (lysp_include *)0x0) {
      uVar23 = 0;
    }
    else {
      uVar23 = *(ulong *)(plVar17[-1].rev + 8);
    }
    if (uVar23 <= uVar21) {
      return LY_SUCCESS;
    }
    submod = (lysp_submodule *)0x0;
    bVar8 = false;
    local_c4 = unaff_EBP;
    if (plVar17[uVar21].submodule == (lysp_submodule *)0x0) {
      plVar17 = plVar17 + uVar21;
      local_80 = (undefined8 *)CONCAT71(local_80._1_7_,pmod->field_0x79);
      if ((pmod->field_0x79 & 2) != 0) {
        plVar2 = (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
        puVar14 = *(undefined8 **)plVar2;
        plVar13 = (long *)puVar14[10];
        lVar3 = plVar13[3];
        uVar23 = 0xffffffffffffffff;
        pcVar19 = (char *)(lVar3 + -0x10);
        do {
          pcVar16 = pcVar19;
          if (lVar3 == 0) {
            uVar22 = 0;
          }
          else {
            uVar22 = *(ulong *)(lVar3 + -8);
          }
          uVar23 = uVar23 + 1;
          if (uVar22 <= uVar23) {
            local_c4 = LY_ENOT;
            if ((char)plVar13[0xf] == '\x02') {
              if (pctx == (lysp_ctx *)0x0) {
                plVar20 = (ly_ctx *)0x0;
              }
              else {
                plVar20 = (ly_ctx *)*puVar14;
              }
              ly_vlog(plVar20,(char *)0x0,LYVE_REFERENCE,
                      "YANG 1.1 requires all submodules to be included from main module. But submodule \"%s\" includes submodule \"%s\" which is not included by main module \"%s\"."
                      ,plVar2[2].parent,plVar17->name,*(undefined8 *)(*plVar13 + 8));
              local_c4 = LY_EVALID;
            }
            goto LAB_00163be9;
          }
          __s1 = *(char **)(pcVar16 + 0x18);
          pcVar19 = pcVar16 + 0x38;
          iVar9 = strcmp(__s1,plVar17->name);
        } while (iVar9 != 0);
        if (plVar17->rev[0] == '\0') {
LAB_00163b47:
          plVar5 = *(lysp_submodule **)(pcVar16 + 0x10);
          plVar17->submodule = plVar5;
          local_c4 = LY_SUCCESS;
          if (plVar5 == (lysp_submodule *)0x0) {
            local_c4 = LY_ENOT;
          }
        }
        else {
          iVar9 = strncmp(plVar17->rev,pcVar19,0xb);
          if (iVar9 == 0) goto LAB_00163b47;
          if (pctx == (lysp_ctx *)0x0) {
            plVar20 = (ly_ctx *)0x0;
          }
          else {
            plVar20 = (ly_ctx *)*puVar14;
          }
          ly_vlog(plVar20,(char *)0x0,LYVE_REFERENCE,
                  "Submodule %s includes different revision (%s) of the submodule %s:%s included by the main module %s."
                  ,plVar2[2].parent,plVar17->rev,__s1,pcVar19,*(undefined8 *)(*plVar13 + 8));
          local_c4 = LY_EVALID;
        }
LAB_00163be9:
        bVar8 = true;
        if (local_c4 != LY_ENOT) goto LAB_00163a34;
      }
      local_c4 = LY_ENOT;
      bVar18 = true;
      uVar15 = pctx->parsed_mods->count - 1;
      if (uVar15 != 0) {
        pplVar4 = (pctx->parsed_mods->field_2).dnodes;
        uVar23 = (ulong)uVar15;
        uVar22 = 0;
        do {
          plVar5 = (lysp_submodule *)pplVar4[uVar22];
          if ((plVar5->field_0x79 & 2) != 0) {
            pcVar19 = plVar5->name;
            iVar9 = strcmp(pcVar19,plVar17->name);
            if (iVar9 == 0) {
              if ((plVar17->rev[0] != '\0') && (__s2 = plVar5->revs, __s2 != (lysp_revision *)0x0))
              {
                iVar9 = strncmp(plVar17->rev,__s2->date,0xb);
                if (iVar9 != 0) {
                  if (pctx == (lysp_ctx *)0x0) {
                    plVar20 = (ly_ctx *)0x0;
                  }
                  else {
                    plVar20 = (ly_ctx *)**(undefined8 **)pplVar4[uVar23];
                  }
                  bVar18 = false;
                  ly_vlog(plVar20,(char *)0x0,LYVE_REFERENCE,
                          "Submodule %s includes different revision (%s) of the submodule %s:%s included by the main module %s."
                          ,pplVar4[uVar23][2].parent,plVar17->rev,pcVar19,__s2,
                          *(undefined8 *)(*(long *)pplVar4[uVar23] + 8));
                  local_c4 = LY_EVALID;
                  break;
                }
              }
              plVar17->submodule = plVar5;
              bVar18 = false;
              local_c4 = LY_SUCCESS;
              break;
            }
          }
          uVar22 = uVar22 + 1;
        } while (uVar23 != uVar22);
      }
      bVar8 = true;
      if (bVar18) {
        if ((ctx->flags & 0x20) != 0) goto LAB_00163e1d;
        while( true ) {
          if (ctx->imp_clb != (ly_module_imp_clb)0x0) {
            submodule_data = (char *)0x0;
            format = LYS_IN_UNKNOWN;
            submodule_data_free = (_func_void_void_ptr_void_ptr *)0x0;
            check_data.path = (char *)0x0;
            check_data.submoduleof = (char *)0x0;
            check_data.name = (char *)0x0;
            check_data.revision = (char *)0x0;
            pcVar19 = plVar17->rev;
            pcVar16 = pcVar19;
            if (plVar17->rev[0] == '\0') {
              pcVar16 = (char *)0x0;
            }
            LVar10 = (*ctx->imp_clb)(*(char **)(*(long *)(pctx->parsed_mods->field_2).dnodes
                                                         [pctx->parsed_mods->count - 1] + 8),
                                     (char *)0x0,plVar17->name,pcVar16,ctx->imp_clb_data,&format,
                                     &submodule_data,&submodule_data_free);
            bVar18 = true;
            local_c4 = unaff_EBP;
            if (LVar10 == LY_SUCCESS) {
              local_c4 = ly_in_new_memory(submodule_data,&in);
              if (local_c4 == LY_SUCCESS) {
                check_data.name = plVar17->name;
                if (plVar17->rev[0] == '\0') {
                  pcVar19 = (char *)0x0;
                }
                check_data.submoduleof =
                     *(char **)(*(long *)(pctx->parsed_mods->field_2).dnodes
                                         [pctx->parsed_mods->count - 1] + 8);
                check_data.revision = pcVar19;
                lys_parse_submodule(ctx,in,format,pctx->main_ctx,lysp_load_module_check,&check_data,
                                    local_70,&submod);
                plVar17 = pmod->includes + uVar21;
                ly_in_free(in,'\0');
                if (submodule_data_free != (_func_void_void_ptr_void_ptr *)0x0) {
                  (*submodule_data_free)(submodule_data,ctx->imp_clb_data);
                }
                bVar18 = true;
                local_c4 = unaff_EBP;
              }
              else {
                bVar18 = false;
              }
            }
            unaff_EBP = local_c4;
            if (!bVar18) goto LAB_00163a34;
          }
          if ((submod != (lysp_submodule *)0x0) || ((ctx->flags & 0x20) != 0)) break;
LAB_00163e1d:
          if ((ctx->flags & 8) == 0) {
            pcVar19 = (char *)0x0;
            if (plVar17->rev[0] != '\0') {
              pcVar19 = plVar17->rev;
            }
            plVar6 = pctx->main_ctx->parsed_mods;
            lys_parse_localfile(ctx,plVar17->name,pcVar19,pctx->main_ctx,
                                *(char **)(*(long *)(plVar6->field_2).dnodes[plVar6->count - 1] + 8)
                                ,'\x01',local_70,&submod);
            plVar17 = pmod->includes + uVar21;
          }
          if ((submod != (lysp_submodule *)0x0) || ((ctx->flags & 0x20) == 0)) break;
        }
        if (submod != (lysp_submodule *)0x0) {
          if ((plVar17->rev[0] == '\0') && ((submod->field_0x79 & 0xc) == 4)) {
            submod->field_0x79 = submod->field_0x79 & 0xf3 | 8;
          }
          plVar17->submodule = submod;
          if (((ulong)local_80 & 2) != 0) {
            plVar11 = pmod->includes + uVar21;
            local_80 = *(undefined8 **)
                        (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
            lVar3 = local_80[10];
            lVar7 = *(long *)(lVar3 + 0x18);
            __ptr = (ulong *)(lVar7 + -8);
            puVar14 = (undefined8 *)(lVar7 + -0x38);
            uVar23 = 0xffffffffffffffff;
            do {
              if (lVar7 == 0) {
                uVar22 = 0;
              }
              else {
                uVar22 = *__ptr;
              }
              uVar23 = uVar23 + 1;
              if (uVar22 <= uVar23) {
                puVar14 = (undefined8 *)0x0;
                break;
              }
              puVar1 = puVar14 + 8;
              puVar14 = puVar14 + 7;
              iVar9 = strcmp((char *)*puVar1,plVar11->name);
            } while (iVar9 != 0);
            if (puVar14 == (undefined8 *)0x0) {
              if (lVar7 == 0) {
                plVar13 = (long *)malloc(0x40);
                if (plVar13 == (long *)0x0) {
                  puVar14 = local_80;
                  if (pctx != (lysp_ctx *)0x0) goto LAB_001641d7;
LAB_001641dc:
                  plVar20 = (ly_ctx *)0x0;
                  goto LAB_001641de;
                }
                *plVar13 = 1;
              }
              else {
                uVar23 = *__ptr;
                *__ptr = uVar23 + 1;
                plVar13 = (long *)realloc(__ptr,uVar23 * 0x38 + 0x40);
                if (plVar13 == (long *)0x0) {
                  plVar13 = (long *)(*(long *)(lVar3 + 0x18) + -8);
                  *plVar13 = *plVar13 + -1;
                  if (pctx == (lysp_ctx *)0x0) goto LAB_001641dc;
                  puVar14 = *(undefined8 **)
                             (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
LAB_001641d7:
                  plVar20 = (ly_ctx *)*puVar14;
LAB_001641de:
                  local_c4 = LY_EMEM;
                  ly_log(plVar20,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                         "lysp_inject_submodule");
                  goto LAB_00163f7e;
                }
              }
              *(long **)(lVar3 + 0x18) = plVar13 + 1;
              lVar3 = *plVar13;
              plVar13[lVar3 * 7 + -2] = 0;
              (plVar13 + lVar3 * 7 + -2)[1] = 0;
              plVar13[lVar3 * 7 + -4] = 0;
              (plVar13 + lVar3 * 7 + -4)[1] = 0;
              plVar13[lVar3 * 7 + -6] = 0;
              (plVar13 + lVar3 * 7 + -6)[1] = 0;
              plVar13[lVar3 * 7] = 0;
              plVar13[lVar3 * 7 + -6] = (long)plVar11->submodule;
              if (pctx == (lysp_ctx *)0x0) {
                plVar20 = (ly_ctx *)0x0;
              }
              else {
                plVar20 = (ly_ctx *)
                          **(undefined8 **)
                            (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
              }
              LVar10 = lydict_dup(plVar20,plVar11->name,(char **)(plVar13 + lVar3 * 7 + -5));
              local_c4 = LVar10 + (LVar10 == LY_SUCCESS);
              if (LVar10 == LY_SUCCESS) {
                if (pctx == (lysp_ctx *)0x0) {
                  plVar20 = (ly_ctx *)0x0;
                }
                else {
                  plVar20 = (ly_ctx *)
                            **(undefined8 **)
                              (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
                }
                local_c4 = lydict_dup(plVar20,plVar11->dsc,(char **)(plVar13 + lVar3 * 7 + -4));
                if (local_c4 == LY_SUCCESS) {
                  if (pctx == (lysp_ctx *)0x0) {
                    plVar20 = (ly_ctx *)0x0;
                  }
                  else {
                    plVar20 = (ly_ctx *)
                              **(undefined8 **)
                                (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
                  }
                  local_c4 = lydict_dup(plVar20,plVar11->ref,(char **)(plVar13 + lVar3 * 7 + -3));
                  if (local_c4 == LY_SUCCESS) {
                    *(undefined4 *)((long)plVar13 + lVar3 * 0x38 + -1) =
                         *(undefined4 *)(plVar11->rev + 7);
                    plVar13[lVar3 * 7 + -1] = *(long *)plVar11->rev;
                    *(undefined1 *)((long)plVar13 + lVar3 * 0x38 + 3) = 1;
                    local_c4 = LY_SUCCESS;
                  }
                }
              }
            }
            else {
              *puVar14 = plVar11->submodule;
              local_c4 = LY_SUCCESS;
            }
LAB_00163f7e:
            if (local_c4 != LY_SUCCESS) goto LAB_00163a34;
          }
        }
        bVar8 = false;
        local_c4 = unaff_EBP;
        if (plVar17->submodule == (lysp_submodule *)0x0) {
          plVar2 = (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
          if (((ulong)plVar2[2].schema & 0x200) == 0) {
            pplVar12 = (lyd_node_inner **)(*(long *)plVar2 + 8);
          }
          else {
            pplVar12 = &plVar2[2].parent;
          }
          ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,"Including \"%s\" submodule into \"%s\" failed.",
                  plVar17->name,*pplVar12);
          local_c4 = LY_EVALID;
          bVar8 = true;
        }
      }
    }
LAB_00163a34:
    if (bVar8) {
      return local_c4;
    }
    uVar21 = uVar21 + 1;
    unaff_EBP = local_c4;
  } while( true );
}

Assistant:

LY_ERR
lysp_load_submodules(struct lysp_ctx *pctx, struct lysp_module *pmod, struct ly_set *new_mods)
{
    LY_ARRAY_COUNT_TYPE u;
    struct ly_ctx *ctx = PARSER_CTX(pctx);

    LY_ARRAY_FOR(pmod->includes, u) {
        LY_ERR ret = LY_SUCCESS, r;
        struct lysp_submodule *submod = NULL;
        struct lysp_include *inc = &pmod->includes[u];

        if (inc->submodule) {
            continue;
        }

        if (pmod->is_submod) {
            /* try to find the submodule in the main module or its submodules */
            ret = lysp_main_pmod_get_submodule(pctx, inc);
            LY_CHECK_RET(ret != LY_ENOT, ret);
        }

        /* try to use currently parsed submodule */
        r = lysp_parsed_mods_get_submodule(pctx, inc);
        LY_CHECK_RET(r != LY_ENOT, r);

        /* submodule not present in the main module, get the input data and parse it */
        if (!(ctx->flags & LY_CTX_PREFER_SEARCHDIRS)) {
search_clb:
            if (ctx->imp_clb) {
                const char *submodule_data = NULL;
                LYS_INFORMAT format = LYS_IN_UNKNOWN;

                void (*submodule_data_free)(void *module_data, void *user_data) = NULL;
                struct lysp_load_module_check_data check_data = {0};
                struct ly_in *in;

                if (ctx->imp_clb(PARSER_CUR_PMOD(pctx)->mod->name, NULL, inc->name,
                        inc->rev[0] ? inc->rev : NULL, ctx->imp_clb_data,
                        &format, &submodule_data, &submodule_data_free) == LY_SUCCESS) {
                    LY_CHECK_RET(ly_in_new_memory(submodule_data, &in));
                    check_data.name = inc->name;
                    check_data.revision = inc->rev[0] ? inc->rev : NULL;
                    check_data.submoduleof = PARSER_CUR_PMOD(pctx)->mod->name;
                    lys_parse_submodule(ctx, in, format, pctx->main_ctx, lysp_load_module_check, &check_data, new_mods,
                            &submod);

                    /* update inc pointer - parsing another (YANG 1.0) submodule can cause injecting
                     * submodule's include into main module, where it is missing */
                    inc = &pmod->includes[u];

                    ly_in_free(in, 0);
                    if (submodule_data_free) {
                        submodule_data_free((void *)submodule_data, ctx->imp_clb_data);
                    }
                }
            }
            if (!submod && !(ctx->flags & LY_CTX_PREFER_SEARCHDIRS)) {
                goto search_file;
            }
        } else {
search_file:
            if (!(ctx->flags & LY_CTX_DISABLE_SEARCHDIRS)) {
                /* submodule was not received from the callback or there is no callback set */
                lys_parse_localfile(ctx, inc->name, inc->rev[0] ? inc->rev : NULL, pctx->main_ctx,
                        PARSER_CUR_PMOD(pctx->main_ctx)->mod->name, 1, new_mods, (void **)&submod);

                /* update inc pointer - parsing another (YANG 1.0) submodule can cause injecting
                 * submodule's include into main module, where it is missing */
                inc = &pmod->includes[u];
            }
            if (!submod && (ctx->flags & LY_CTX_PREFER_SEARCHDIRS)) {
                goto search_clb;
            }
        }
        if (submod) {
            if (!inc->rev[0] && (submod->latest_revision == 1)) {
                /* update the latest_revision flag - here we have selected the latest available schema,
                 * consider that even the callback provides correct latest revision */
                submod->latest_revision = 2;
            }

            inc->submodule = submod;
            if (ret == LY_ENOT) {
                /* the submodule include is not present in YANG 1.0 main module - add it there */
                LY_CHECK_RET(lysp_inject_submodule(pctx, &pmod->includes[u]));
            }
        }
        if (!inc->submodule) {
            LOGVAL(ctx, LYVE_REFERENCE, "Including \"%s\" submodule into \"%s\" failed.", inc->name,
                    PARSER_CUR_PMOD(pctx)->is_submod ? ((struct lysp_submodule *)PARSER_CUR_PMOD(pctx))->name :
                    PARSER_CUR_PMOD(pctx)->mod->name);
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}